

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigObj.c
# Opt level: O0

int Aig_ManPropagateBuffers(Aig_Man_t *p,int fUpdateLevel)

{
  int iVar1;
  int local_24;
  Aig_Obj_t *pAStack_20;
  int nSteps;
  Aig_Obj_t *pObj;
  int fUpdateLevel_local;
  Aig_Man_t *p_local;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigObj.c"
                  ,0x1b4,"int Aig_ManPropagateBuffers(Aig_Man_t *, int)");
  }
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(p->vBufs);
    if (iVar1 < 1) {
      return local_24;
    }
    pAStack_20 = (Aig_Obj_t *)Vec_PtrEntryLast(p->vBufs);
    while (iVar1 = Aig_ObjIsBuf(pAStack_20), iVar1 != 0) {
      pAStack_20 = Aig_ObjFanout0(p,pAStack_20);
    }
    Aig_NodeFixBufferFanins(p,pAStack_20,fUpdateLevel);
    if (1000000 < local_24) break;
    local_24 = local_24 + 1;
  }
  printf("Error: A cycle is encountered while propagating buffers.\n");
  return local_24;
}

Assistant:

int Aig_ManPropagateBuffers( Aig_Man_t * p, int fUpdateLevel )
{
    Aig_Obj_t * pObj;
    int nSteps;
    assert( p->pFanData );
    for ( nSteps = 0; Vec_PtrSize(p->vBufs) > 0; nSteps++ )
    {
        // get the node with a buffer fanin
        for ( pObj = (Aig_Obj_t *)Vec_PtrEntryLast(p->vBufs); Aig_ObjIsBuf(pObj); pObj = Aig_ObjFanout0(p, pObj) );
        // replace this node by a node without buffer
        Aig_NodeFixBufferFanins( p, pObj, fUpdateLevel );
        // stop if a cycle occured
        if ( nSteps > 1000000 )
        {
            printf( "Error: A cycle is encountered while propagating buffers.\n" );
            break;
        }
    }
    return nSteps;
}